

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

void __thiscall
SQLexer::Init(SQLexer *this,SQSharedState *ss,char *sourceText,size_t sourceTextSize)

{
  SQUnsignedInteger *pSVar1;
  LexChar LVar2;
  SQTable *pSVar3;
  ulong uVar4;
  SQObjectPtr local_58;
  SQObjectPtr local_48;
  char *local_38;
  
  this->_sharedstate = ss;
  local_38 = sourceText;
  pSVar3 = (SQTable *)sq_vm_malloc(ss->_alloc_ctx,0x60);
  SQTable::SQTable(pSVar3,ss,0x26);
  (pSVar3->super_SQDelegable)._delegate = (SQTable *)0x0;
  this->_keywords = pSVar3;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"while",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x112;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"do",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x115;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"if",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x110;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"else",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x111;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"break",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x113;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"continue",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x123;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"return",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x11e;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"null",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x116;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"function",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x11d;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"local",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x11b;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"for",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x114;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"foreach",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x117;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"in",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x118;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"typeof",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x11f;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"base",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x106;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"delete",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x107;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"try",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x125;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"catch",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x126;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"throw",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x127;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"clone",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x11c;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"yield",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x124;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"resume",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x12a;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"switch",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x10c;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"case",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 300;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"default",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x12d;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"this",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x12e;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"class",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x133;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"constructor",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x136;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"instanceof",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x137;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"true",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x13b;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"false",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x13c;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"static",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x142;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"enum",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x143;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"const",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x144;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"__LINE__",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x139;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"__FILE__",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x13a;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"global",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x14b;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"not",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x14e;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  pSVar3 = this->_keywords;
  local_48.super_SQObject._unVal.pString = SQString::Create(ss,"let",-1);
  local_48.super_SQObject._type = OT_STRING;
  local_48.super_SQObject._flags = '\0';
  pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_58.super_SQObject._type = OT_INTEGER;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._unVal.nInteger = 0x150;
  SQTable::NewSlot(pSVar3,&local_48,&local_58);
  SQObjectPtr::~SQObjectPtr(&local_58);
  SQObjectPtr::~SQObjectPtr(&local_48);
  this->_sourceText = local_38;
  this->_sourceTextSize = sourceTextSize;
  uVar4 = 0;
  this->_sourceTextPtr = 0;
  this->_currentline = 1;
  this->_lasttokenline = 1;
  this->_lasttokencolumn = 0;
  this->_currentcolumn = 0;
  this->_prevtoken = -1;
  this->_tokencolumn = 0;
  this->_tokenline = 1;
  this->_reached_eof = 0;
  if (this->_comments != (Comments *)0x0) {
    SQCompilation::Comments::pushNewLine(this->_comments);
    sourceTextSize = this->_sourceTextSize;
    uVar4 = this->_sourceTextPtr;
  }
  if (uVar4 < sourceTextSize) {
    this->_sourceTextPtr = uVar4 + 1;
    LVar2 = this->_sourceText[uVar4];
  }
  else {
    this->_reached_eof = 1;
    LVar2 = '\0';
  }
  this->_currdata = LVar2;
  return;
}

Assistant:

void SQLexer::Init(SQSharedState *ss, const char *sourceText, size_t sourceTextSize)
{
    _sharedstate = ss;
    _keywords = SQTable::Create(ss, 38);
    ADD_KEYWORD(while, TK_WHILE);
    ADD_KEYWORD(do, TK_DO);
    ADD_KEYWORD(if, TK_IF);
    ADD_KEYWORD(else, TK_ELSE);
    ADD_KEYWORD(break, TK_BREAK);
    ADD_KEYWORD(continue, TK_CONTINUE);
    ADD_KEYWORD(return, TK_RETURN);
    ADD_KEYWORD(null, TK_NULL);
    ADD_KEYWORD(function, TK_FUNCTION);
    ADD_KEYWORD(local, TK_LOCAL);
    ADD_KEYWORD(for, TK_FOR);
    ADD_KEYWORD(foreach, TK_FOREACH);
    ADD_KEYWORD(in, TK_IN);
    ADD_KEYWORD(typeof, TK_TYPEOF);
    ADD_KEYWORD(base, TK_BASE);
    ADD_KEYWORD(delete, TK_DELETE);
    ADD_KEYWORD(try, TK_TRY);
    ADD_KEYWORD(catch, TK_CATCH);
    ADD_KEYWORD(throw, TK_THROW);
    ADD_KEYWORD(clone, TK_CLONE);
    ADD_KEYWORD(yield, TK_YIELD);
    ADD_KEYWORD(resume, TK_RESUME);
    ADD_KEYWORD(switch, TK_SWITCH);
    ADD_KEYWORD(case, TK_CASE);
    ADD_KEYWORD(default, TK_DEFAULT);
    ADD_KEYWORD(this, TK_THIS);
    ADD_KEYWORD(class,TK_CLASS);
    ADD_KEYWORD(constructor,TK_CONSTRUCTOR);
    ADD_KEYWORD(instanceof,TK_INSTANCEOF);
    ADD_KEYWORD(true,TK_TRUE);
    ADD_KEYWORD(false,TK_FALSE);
    ADD_KEYWORD(static,TK_STATIC);
    ADD_KEYWORD(enum,TK_ENUM);
    ADD_KEYWORD(const,TK_CONST);
    ADD_KEYWORD(__LINE__,TK___LINE__);
    ADD_KEYWORD(__FILE__,TK___FILE__);
    ADD_KEYWORD(global, TK_GLOBAL);
    ADD_KEYWORD(not, TK_NOT);
    ADD_KEYWORD(let, TK_LET);


    _sourceText = sourceText;
    _sourceTextSize = sourceTextSize;
    _sourceTextPtr = 0;
    _lasttokenline = _currentline = 1;
    _lasttokencolumn = _currentcolumn = 0;
    _prevtoken = -1;
    _tokencolumn = 0;
    _tokenline = 1;
    _reached_eof = SQFalse;
    if (_comments)
      _comments->pushNewLine();
    Next();
}